

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::isCodeBlockLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,CTokenGroupIter *i,
          CTokenGroupIter end)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference psVar5;
  type pTVar6;
  reference_type __rhs;
  ulong uVar7;
  reference pcVar8;
  byte local_109;
  allocator<char> local_e9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  const_iterator sie;
  const_iterator si;
  string *line;
  uint local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  CTokenGroupIter *local_60;
  undefined1 local_58 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  CTokenGroupIter *i_local;
  CTokenGroupIter end_local;
  
  r.super_type.m_storage.dummy_._24_8_ = this;
  i_local = i;
  end_local._M_node = (_List_node_base *)__return_storage_ptr__;
  psVar5 = std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator*
                     ((_List_const_iterator<boost::shared_ptr<markdown::Token>_> *)this);
  pTVar6 = boost::shared_ptr<markdown::Token>::operator->(psVar5);
  uVar3 = (*pTVar6->_vptr_Token[9])();
  if ((uVar3 & 1) == 0) {
    psVar5 = std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator*
                       ((_List_const_iterator<boost::shared_ptr<markdown::Token>_> *)
                        r.super_type.m_storage.dummy_._24_8_);
    pTVar6 = boost::shared_ptr<markdown::Token>::operator->(psVar5);
    (*pTVar6->_vptr_Token[7])(&line);
    bVar1 = boost::
            optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::operator!((optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                         *)&line);
    local_109 = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      psVar5 = std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator*
                         ((_List_const_iterator<boost::shared_ptr<markdown::Token>_> *)
                          r.super_type.m_storage.dummy_._24_8_);
      pTVar6 = boost::shared_ptr<markdown::Token>::operator->(psVar5);
      iVar4 = (*pTVar6->_vptr_Token[8])();
      local_109 = (byte)iVar4;
    }
    if ((local_109 & 1) != 0) {
      psVar5 = std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator*
                         ((_List_const_iterator<boost::shared_ptr<markdown::Token>_> *)
                          r.super_type.m_storage.dummy_._24_8_);
      pTVar6 = boost::shared_ptr<markdown::Token>::operator->(psVar5);
      (*pTVar6->_vptr_Token[7])(&si);
      boost::
      optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::operator*((optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   *)&si);
      uVar7 = std::__cxx11::string::length();
      if (3 < uVar7) {
        sie._M_current = (char *)std::__cxx11::string::begin();
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&sie,4);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=(&sie,&local_b8);
          bVar1 = false;
          if (bVar2) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&sie);
            bVar1 = *pcVar8 == ' ';
          }
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&sie);
        }
        bVar1 = __gnu_cxx::operator==(&sie,&local_b8);
        if (bVar1) {
          std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator++
                    ((_List_const_iterator<boost::shared_ptr<markdown::Token>_> *)
                     r.super_type.m_storage.dummy_._24_8_);
          local_e0._M_current = sie._M_current;
          local_e8._M_current = (char *)std::__cxx11::string::end();
          std::allocator<char>::allocator();
          std::__cxx11::string::
          string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)&local_d8,local_e0,local_e8,&local_e9);
          boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional(__return_storage_ptr__,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_e9);
          return __return_storage_ptr__;
        }
      }
    }
  }
  else {
    std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator++
              ((_List_const_iterator<boost::shared_ptr<markdown::Token>_> *)
               r.super_type.m_storage.dummy_._24_8_);
    bVar1 = std::operator!=((_Self *)r.super_type.m_storage.dummy_._24_8_,(_Self *)&i_local);
    if (bVar1) {
      local_60 = i_local;
      isCodeBlockLine_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_58,(_anonymous_namespace_ *)r.super_type.m_storage.dummy_._24_8_,i_local,
                 end);
      bVar1 = boost::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_58);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        __rhs = boost::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_58);
        std::operator+(&local_80,"\n",__rhs);
        boost::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(__return_storage_ptr__,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
      local_90 = (uint)bVar1;
      boost::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_58);
      if (local_90 != 0) {
        return __return_storage_ptr__;
      }
    }
    std::_List_const_iterator<boost::shared_ptr<markdown::Token>_>::operator--
              ((_List_const_iterator<boost::shared_ptr<markdown::Token>_> *)
               r.super_type.m_storage.dummy_._24_8_);
  }
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> isCodeBlockLine(CTokenGroupIter& i, CTokenGroupIter end) {
	if ((*i)->isBlankLine()) {
		// If we get here, we're already in a code block.
		++i;
		if (i!=end) {
			optional<std::string> r=isCodeBlockLine(i, end);
			if (r) return std::string("\n"+*r);
		}
		--i;
	} else if ((*i)->text() && (*i)->canContainMarkup()) {
		const std::string& line(*(*i)->text());
		if (line.length()>=4) {
			std::string::const_iterator si=line.begin(), sie=si+4;
			while (si!=sie && *si==' ') ++si;
			if (si==sie) {
				++i;
				return std::string(si, line.end());
			}
		}
	}
	return none;
}